

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::Array<capnp::Orphan<capnp::compiler::Declaration>_>::~Array
          (Array<capnp::Orphan<capnp::compiler::Declaration>_> *this)

{
  Orphan<capnp::compiler::Declaration> *pOVar1;
  size_t sVar2;
  
  pOVar1 = this->ptr;
  if (pOVar1 != (Orphan<capnp::compiler::Declaration> *)0x0) {
    sVar2 = this->size_;
    this->ptr = (Orphan<capnp::compiler::Declaration> *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pOVar1,0x20,sVar2,sVar2,
               ArrayDisposer::Dispose_<capnp::Orphan<capnp::compiler::Declaration>_>::destruct);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }